

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Cast_x86_avx512::forward(Cast_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  Mat *bottom_blob_00;
  int iVar9;
  Option *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  bool bVar10;
  int i;
  float *outptr;
  char *ptr;
  int q;
  int size;
  size_t out_elemsize;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Mat *in_stack_000001e0;
  Mat *in_stack_000001e8;
  Cast *in_stack_000001f0;
  Mat *m_1;
  size_t in_stack_fffffffffffffc98;
  Allocator *in_stack_fffffffffffffca0;
  int _d;
  size_t in_stack_fffffffffffffca8;
  int _w;
  Mat *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  int _w_00;
  Mat *in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffd10;
  int local_2ec;
  Allocator *in_stack_fffffffffffffd18;
  Allocator *in_stack_fffffffffffffd20;
  Option *in_stack_fffffffffffffda8;
  undefined4 uVar11;
  Mat *in_stack_fffffffffffffdb0;
  Mat *in_stack_fffffffffffffdb8;
  Option *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc8;
  Mat *pMVar12;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int iVar13;
  
  if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) ==
      *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4)) {
    if (in_RDX != in_RSI) {
      if (in_RSI->refcount != (int *)0x0) {
        LOCK();
        *in_RSI->refcount = *in_RSI->refcount + 1;
        UNLOCK();
      }
      if (in_RDX->refcount != (int *)0x0) {
        piVar5 = in_RDX->refcount;
        LOCK();
        iVar13 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (iVar13 == 1) {
          if (in_RDX->allocator == (Allocator *)0x0) {
            if (in_RDX->data != (void *)0x0) {
              free(in_RDX->data);
            }
          }
          else {
            (*in_RDX->allocator->_vptr_Allocator[3])(in_RDX->allocator,in_RDX->data);
          }
        }
      }
      in_RDX->data = (void *)0x0;
      in_RDX->elemsize = 0;
      in_RDX->elempack = 0;
      in_RDX->dims = 0;
      in_RDX->w = 0;
      in_RDX->h = 0;
      in_RDX->d = 0;
      in_RDX->c = 0;
      in_RDX->cstep = 0;
      in_RDX->refcount = (int *)0x0;
      in_RDX->data = in_RSI->data;
      in_RDX->refcount = in_RSI->refcount;
      in_RDX->elemsize = in_RSI->elemsize;
      in_RDX->elempack = in_RSI->elempack;
      in_RDX->allocator = in_RSI->allocator;
      in_RDX->dims = in_RSI->dims;
      in_RDX->w = in_RSI->w;
      in_RDX->h = in_RSI->h;
      in_RDX->d = in_RSI->d;
      in_RDX->c = in_RSI->c;
      in_RDX->cstep = in_RSI->cstep;
    }
    iVar13 = 0;
  }
  else {
    iVar13 = in_RSI->w;
    iVar1 = in_RSI->h;
    iVar2 = in_RSI->d;
    iVar3 = in_RSI->c;
    iVar4 = in_RSI->dims;
    bottom_blob_00 = (Mat *)in_RSI->elemsize;
    iVar9 = in_RSI->elempack;
    pMVar12 = in_RDI;
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) {
      if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 3) {
        Cast::forward(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,(Option *)m);
      }
      bottom_blob_00 = (Mat *)(long)(iVar9 << 2);
    }
    else if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 2) {
      bottom_blob_00 = (Mat *)(long)(iVar9 << 1);
    }
    else if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 3) {
      bottom_blob_00 = (Mat *)(long)iVar9;
    }
    else if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 4) {
      bottom_blob_00 = (Mat *)(long)(iVar9 << 1);
    }
    _w = (int)(in_stack_fffffffffffffca8 >> 0x20);
    _w_00 = (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
    if (iVar4 == 1) {
      Mat::create(in_stack_fffffffffffffcc0,_w_00,(size_t)in_stack_fffffffffffffcb0,_w,
                  in_stack_fffffffffffffca0);
    }
    else if (iVar4 == 2) {
      Mat::create(in_stack_fffffffffffffcc0,_w_00,(int)in_stack_fffffffffffffcb8,
                  (size_t)in_stack_fffffffffffffcb0,_w,in_stack_fffffffffffffca0);
    }
    else {
      _d = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
      if (iVar4 == 3) {
        Mat::create(in_stack_fffffffffffffcc0,_w_00,(int)in_stack_fffffffffffffcb8,
                    (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20),in_stack_fffffffffffffca8,_d,
                    in_stack_fffffffffffffd20);
      }
      else if (iVar4 == 4) {
        Mat::create(in_stack_fffffffffffffcb0,_w,(int)in_stack_fffffffffffffca8,_d,
                    (int)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                    in_stack_fffffffffffffd10,in_stack_fffffffffffffd18);
      }
    }
    bVar10 = true;
    if (in_RDX->data != (void *)0x0) {
      bVar10 = in_RDX->cstep * (long)in_RDX->c == 0;
    }
    if (bVar10) {
      iVar13 = -100;
    }
    else {
      iVar9 = iVar13 * iVar1 * iVar2 * iVar9;
      if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 1) &&
         (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 2)) {
        cast_fp32_to_fp16_sse(in_RSI,in_RDX,in_RCX);
      }
      if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 2) &&
         (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) {
        cast_fp16_to_fp32_sse
                  ((Mat *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),pMVar12,
                   (Option *)in_RSI);
      }
      if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 3) &&
         (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) {
        for (in_stack_fffffffffffffdc8 = 0; in_stack_fffffffffffffdc8 < iVar3;
            in_stack_fffffffffffffdc8 = in_stack_fffffffffffffdc8 + 1) {
          in_stack_fffffffffffffdc0 =
               (Option *)
               ((long)in_RSI->data +
               in_RSI->cstep * (long)in_stack_fffffffffffffdc8 * in_RSI->elemsize);
          iVar13 = in_RSI->h;
          uVar11 = 1;
          iVar13 = in_RSI->d;
          uVar11 = 0;
          uVar11 = 0;
          in_stack_fffffffffffffdb8 = (Mat *)0x0;
          pvVar6 = in_RDX->data;
          sVar7 = in_RDX->cstep;
          sVar8 = in_RDX->elemsize;
          for (local_2ec = 0; local_2ec < iVar9; local_2ec = local_2ec + 1) {
            *(float *)((long)pvVar6 +
                      (long)local_2ec * 4 + sVar7 * (long)in_stack_fffffffffffffdc8 * sVar8) =
                 (float)(int)(&in_stack_fffffffffffffdc0->lightmode)[local_2ec];
          }
        }
      }
      if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 1) &&
         (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 4)) {
        cast_fp32_to_bf16_sse
                  (bottom_blob_00,(Mat *)CONCAT44(iVar9,in_stack_fffffffffffffdc8),
                   in_stack_fffffffffffffdc0);
      }
      if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 4) &&
         (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) {
        cast_bf16_to_fp32_sse
                  (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      }
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

int Cast_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}